

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O2

void Rml::PluginRegistry::NotifyContextDestroy(Context *context)

{
  pointer ppPVar1;
  PluginVectors *pPVar2;
  pointer ppPVar3;
  
  pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                     ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
  ppPVar1 = (pPVar2->basic).super__Vector_base<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar3 = (pPVar2->basic).super__Vector_base<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1
      ) {
    (*(*ppPVar3)->_vptr_Plugin[6])(*ppPVar3,context);
  }
  return;
}

Assistant:

void PluginRegistry::NotifyContextDestroy(Context* context)
{
	for (Plugin* plugin : plugin_vectors->basic)
		plugin->OnContextDestroy(context);
}